

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLinOp::AnyInterpolationAmr
          (MLNodeLinOp *this,int famrlev,Any *a_fine,Any *a_crse,IntVect *nghost)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  MultiFab *file;
  MultiFab *pMVar4;
  int iVar5;
  int iVar6;
  MFIter *in_RDI;
  IntVect *in_R8;
  bool bVar7;
  bool bVar8;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *cfab;
  Array4<double> *ffab;
  Box fbx;
  MFIter mfi;
  int refratio;
  int ncomp;
  MultiFab *crse;
  MultiFab *fine;
  bool k_is_odd;
  bool j_is_odd;
  bool i_is_odd;
  int kc;
  int jc;
  int ic;
  bool k_injection;
  bool j_injection;
  bool i_injection;
  int kc_1;
  int jc_1;
  int ic_1;
  int in_stack_fffffffffffff4ec;
  undefined4 in_stack_fffffffffffff4f0;
  undefined4 in_stack_fffffffffffff4f4;
  undefined4 in_stack_fffffffffffff4f8;
  int in_stack_fffffffffffff4fc;
  undefined4 in_stack_fffffffffffff508;
  undefined4 in_stack_fffffffffffff50c;
  undefined4 in_stack_fffffffffffff514;
  undefined1 do_tiling_;
  undefined4 in_stack_fffffffffffff518;
  undefined4 in_stack_fffffffffffff51c;
  undefined4 in_stack_fffffffffffff520;
  undefined4 in_stack_fffffffffffff524;
  undefined4 in_stack_fffffffffffff528;
  undefined4 in_stack_fffffffffffff52c;
  int local_ad0;
  int local_ac0;
  int local_aa8;
  int local_aa4;
  int local_aa0;
  int local_a9c;
  int local_a58;
  int local_a54;
  int local_a50;
  int local_a4c;
  long local_a08;
  long local_a00;
  long local_9f8;
  long local_9f0;
  int local_9e8;
  int local_9e4;
  int local_9e0;
  long *local_9c8;
  long local_9c0 [8];
  long *local_980;
  Box local_974;
  MFIter local_958;
  
  do_tiling_ = (undefined1)((uint)in_stack_fffffffffffff514 >> 0x18);
  file = Any::get<amrex::MultiFab>
                   ((Any *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  pMVar4 = Any::get<amrex::MultiFab>
                     ((Any *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
  iVar5 = (int)((ulong)pMVar4 >> 0x20);
  iVar2 = (**(code **)((long)&((in_RDI->m_fa)._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                              boxarray + 0x20))();
  iVar3 = MLLinOp::AMRRefRatio
                    ((MLLinOp *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
                     in_stack_fffffffffffff4ec);
  if ((iVar3 != 2) && (iVar3 != 4)) {
    Assert_host((char *)in_R8,(char *)file,iVar5,(char *)CONCAT44(iVar2,iVar3));
  }
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff524,in_stack_fffffffffffff520),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
                 (bool)do_tiling_);
  while (bVar1 = MFIter::isValid(&local_958), bVar1) {
    MFIter::tilebox(in_RDI);
    Box::grow(&local_974,in_R8);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f8),
               (MFIter *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0));
    local_980 = local_9c0;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f8),
               (MFIter *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0));
    local_9c8 = &local_a08;
    if (iVar3 == 2) {
      for (local_a4c = 0; local_a50 = local_974.smallend.vect[2], local_a4c < iVar2;
          local_a4c = local_a4c + 1) {
        for (; local_a54 = local_974.smallend.vect[1], local_a50 <= local_974.bigend.vect[2];
            local_a50 = local_a50 + 1) {
          for (; local_a58 = local_974.smallend.vect[0], local_a54 <= local_974.bigend.vect[1];
              local_a54 = local_a54 + 1) {
            for (; local_a58 <= local_974.bigend.vect[0]; local_a58 = local_a58 + 1) {
              if (local_a58 < 0) {
                iVar5 = local_a58 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_ac0 = -iVar5 / 2 + -1;
              }
              else {
                local_ac0 = local_a58 / 2;
              }
              if (local_a54 < 0) {
                iVar5 = local_a54 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_ad0 = -iVar5 / 2 + -1;
              }
              else {
                local_ad0 = local_a54 / 2;
              }
              if (local_a50 < 0) {
                iVar5 = local_a50 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                iVar5 = -iVar5 / 2 + -1;
              }
              else {
                iVar5 = local_a50 / 2;
              }
              bVar1 = local_ac0 << 1 == local_a58;
              bVar7 = local_ad0 << 1 == local_a54;
              bVar8 = iVar5 << 1 == local_a50;
              if (((bVar1) || (bVar7)) || (bVar8)) {
                if ((bVar7) || (bVar8)) {
                  if ((bVar1) || (bVar8)) {
                    if ((bVar1) || (bVar7)) {
                      if (bVar1) {
                        if (bVar7) {
                          if (bVar8) {
                            *(undefined8 *)
                             (*local_980 +
                             ((long)(local_a58 - (int)local_980[4]) +
                              (long)(local_a54 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                              (long)(local_a50 - (int)local_980[5]) * local_980[2] +
                             (long)local_a4c * local_980[3]) * 8) =
                                 *(undefined8 *)
                                  (local_a08 +
                                  ((long)(local_ac0 - local_9e8) +
                                   (local_ad0 - local_9e4) * local_a00 +
                                   (iVar5 - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8);
                          }
                          else {
                            *(double *)
                             (*local_980 +
                             ((long)(local_a58 - (int)local_980[4]) +
                              (long)(local_a54 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                              (long)(local_a50 - (int)local_980[5]) * local_980[2] +
                             (long)local_a4c * local_980[3]) * 8) =
                                 (*(double *)
                                   (local_a08 +
                                   ((long)(local_ac0 - local_9e8) +
                                    (local_ad0 - local_9e4) * local_a00 +
                                    (iVar5 - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                                 *(double *)
                                  (local_a08 +
                                  ((long)(local_ac0 - local_9e8) +
                                   (local_ad0 - local_9e4) * local_a00 +
                                   ((iVar5 + 1) - local_9e0) * local_9f8 + local_a4c * local_9f0) *
                                  8)) * 0.5;
                          }
                        }
                        else {
                          *(double *)
                           (*local_980 +
                           ((long)(local_a58 - (int)local_980[4]) +
                            (long)(local_a54 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                            (long)(local_a50 - (int)local_980[5]) * local_980[2] +
                           (long)local_a4c * local_980[3]) * 8) =
                               (*(double *)
                                 (local_a08 +
                                 ((long)(local_ac0 - local_9e8) +
                                  (local_ad0 - local_9e4) * local_a00 +
                                  (iVar5 - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                               *(double *)
                                (local_a08 +
                                ((long)(local_ac0 - local_9e8) +
                                 ((local_ad0 + 1) - local_9e4) * local_a00 +
                                 (iVar5 - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8)) *
                               0.5;
                        }
                      }
                      else {
                        *(double *)
                         (*local_980 +
                         ((long)(local_a58 - (int)local_980[4]) +
                          (long)(local_a54 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                          (long)(local_a50 - (int)local_980[5]) * local_980[2] +
                         (long)local_a4c * local_980[3]) * 8) =
                             (*(double *)
                               (local_a08 +
                               ((long)(local_ac0 - local_9e8) + (local_ad0 - local_9e4) * local_a00
                                + (iVar5 - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                             *(double *)
                              (local_a08 +
                              ((long)((local_ac0 + 1) - local_9e8) +
                               (local_ad0 - local_9e4) * local_a00 + (iVar5 - local_9e0) * local_9f8
                              + local_a4c * local_9f0) * 8)) * 0.5;
                      }
                    }
                    else {
                      *(double *)
                       (*local_980 +
                       ((long)(local_a58 - (int)local_980[4]) +
                        (long)(local_a54 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                        (long)(local_a50 - (int)local_980[5]) * local_980[2] +
                       (long)local_a4c * local_980[3]) * 8) =
                           (*(double *)
                             (local_a08 +
                             ((long)(local_ac0 - local_9e8) + (local_ad0 - local_9e4) * local_a00 +
                              (iVar5 - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                            *(double *)
                             (local_a08 +
                             ((long)(local_ac0 - local_9e8) +
                              ((local_ad0 + 1) - local_9e4) * local_a00 +
                              (iVar5 - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                            *(double *)
                             (local_a08 +
                             ((long)((local_ac0 + 1) - local_9e8) +
                              (local_ad0 - local_9e4) * local_a00 + (iVar5 - local_9e0) * local_9f8
                             + local_a4c * local_9f0) * 8) +
                           *(double *)
                            (local_a08 +
                            ((long)((local_ac0 + 1) - local_9e8) +
                             ((local_ad0 + 1) - local_9e4) * local_a00 +
                             (iVar5 - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8)) * 0.25;
                    }
                  }
                  else {
                    *(double *)
                     (*local_980 +
                     ((long)(local_a58 - (int)local_980[4]) +
                      (long)(local_a54 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                      (long)(local_a50 - (int)local_980[5]) * local_980[2] +
                     (long)local_a4c * local_980[3]) * 8) =
                         (*(double *)
                           (local_a08 +
                           ((long)(local_ac0 - local_9e8) + (local_ad0 - local_9e4) * local_a00 +
                            (iVar5 - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                          *(double *)
                           (local_a08 +
                           ((long)(local_ac0 - local_9e8) + (local_ad0 - local_9e4) * local_a00 +
                            ((iVar5 + 1) - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                          *(double *)
                           (local_a08 +
                           ((long)((local_ac0 + 1) - local_9e8) +
                            (local_ad0 - local_9e4) * local_a00 + (iVar5 - local_9e0) * local_9f8 +
                           local_a4c * local_9f0) * 8) +
                         *(double *)
                          (local_a08 +
                          ((long)((local_ac0 + 1) - local_9e8) + (local_ad0 - local_9e4) * local_a00
                           + ((iVar5 + 1) - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8)) *
                         0.25;
                  }
                }
                else {
                  *(double *)
                   (*local_980 +
                   ((long)(local_a58 - (int)local_980[4]) +
                    (long)(local_a54 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                    (long)(local_a50 - (int)local_980[5]) * local_980[2] +
                   (long)local_a4c * local_980[3]) * 8) =
                       (*(double *)
                         (local_a08 +
                         ((long)(local_ac0 - local_9e8) + (local_ad0 - local_9e4) * local_a00 +
                          (iVar5 - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                        *(double *)
                         (local_a08 +
                         ((long)(local_ac0 - local_9e8) + (local_ad0 - local_9e4) * local_a00 +
                          ((iVar5 + 1) - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                        *(double *)
                         (local_a08 +
                         ((long)(local_ac0 - local_9e8) + ((local_ad0 + 1) - local_9e4) * local_a00
                          + (iVar5 - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                       *(double *)
                        (local_a08 +
                        ((long)(local_ac0 - local_9e8) + ((local_ad0 + 1) - local_9e4) * local_a00 +
                         ((iVar5 + 1) - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8)) * 0.25
                  ;
                }
              }
              else {
                *(double *)
                 (*local_980 +
                 ((long)(local_a58 - (int)local_980[4]) +
                  (long)(local_a54 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                  (long)(local_a50 - (int)local_980[5]) * local_980[2] +
                 (long)local_a4c * local_980[3]) * 8) =
                     (*(double *)
                       (local_a08 +
                       ((long)(local_ac0 - local_9e8) + (local_ad0 - local_9e4) * local_a00 +
                        (iVar5 - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                      *(double *)
                       (local_a08 +
                       ((long)(local_ac0 - local_9e8) + (local_ad0 - local_9e4) * local_a00 +
                        ((iVar5 + 1) - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                      *(double *)
                       (local_a08 +
                       ((long)(local_ac0 - local_9e8) + ((local_ad0 + 1) - local_9e4) * local_a00 +
                        (iVar5 - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                      *(double *)
                       (local_a08 +
                       ((long)(local_ac0 - local_9e8) + ((local_ad0 + 1) - local_9e4) * local_a00 +
                        ((iVar5 + 1) - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                      *(double *)
                       (local_a08 +
                       ((long)((local_ac0 + 1) - local_9e8) + (local_ad0 - local_9e4) * local_a00 +
                        (iVar5 - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                      *(double *)
                       (local_a08 +
                       ((long)((local_ac0 + 1) - local_9e8) + (local_ad0 - local_9e4) * local_a00 +
                        ((iVar5 + 1) - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8) +
                      *(double *)
                       (local_a08 +
                       ((long)((local_ac0 + 1) - local_9e8) +
                        ((local_ad0 + 1) - local_9e4) * local_a00 + (iVar5 - local_9e0) * local_9f8
                       + local_a4c * local_9f0) * 8) +
                     *(double *)
                      (local_a08 +
                      ((long)((local_ac0 + 1) - local_9e8) +
                       ((local_ad0 + 1) - local_9e4) * local_a00 +
                       ((iVar5 + 1) - local_9e0) * local_9f8 + local_a4c * local_9f0) * 8)) * 0.125;
              }
            }
          }
        }
      }
    }
    else {
      for (local_a9c = 0; local_aa0 = local_974.smallend.vect[2], local_a9c < iVar2;
          local_a9c = local_a9c + 1) {
        for (; local_aa4 = local_974.smallend.vect[1], local_aa0 <= local_974.bigend.vect[2];
            local_aa0 = local_aa0 + 1) {
          for (; local_aa8 = local_974.smallend.vect[0], local_aa4 <= local_974.bigend.vect[1];
              local_aa4 = local_aa4 + 1) {
            for (; local_aa8 <= local_974.bigend.vect[0]; local_aa8 = local_aa8 + 1) {
              if (local_aa8 < 0) {
                iVar5 = local_aa8 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                iVar5 = -iVar5 / 4 + -1;
              }
              else {
                iVar5 = local_aa8 / 4;
              }
              if (local_aa4 < 0) {
                iVar6 = local_aa4 + 1;
                if (iVar6 < 1) {
                  iVar6 = -iVar6;
                }
                in_stack_fffffffffffff4fc = -iVar6 / 4 + -1;
              }
              else {
                in_stack_fffffffffffff4fc = local_aa4 / 4;
              }
              in_stack_fffffffffffff4f4 = 4;
              if (local_aa0 < 0) {
                iVar6 = local_aa0 + 1;
                if (iVar6 < 1) {
                  iVar6 = -iVar6;
                }
                iVar6 = -iVar6 / 4 + -1;
              }
              else {
                iVar6 = local_aa0 / 4;
              }
              bVar1 = iVar5 << 2 != local_aa8;
              bVar7 = in_stack_fffffffffffff4fc << 2 != local_aa4;
              bVar8 = iVar6 << 2 != local_aa0;
              if (((bVar1) || (bVar7)) || (bVar8)) {
                if ((bVar1) || (bVar7)) {
                  if ((bVar1) || (bVar8)) {
                    if ((bVar7) || (bVar8)) {
                      if (bVar1) {
                        if (bVar7) {
                          if (bVar8) {
                            *(double *)
                             (*local_980 +
                             ((long)(local_aa8 - (int)local_980[4]) +
                              (long)(local_aa4 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                              (long)(local_aa0 - (int)local_980[5]) * local_980[2] +
                             (long)local_a9c * local_980[3]) * 8) =
                                 (*(double *)
                                   (local_a08 +
                                   ((long)((iVar5 + 1) - local_9e8) +
                                    ((in_stack_fffffffffffff4fc + 1) - local_9e4) * local_a00 +
                                    ((iVar6 + 1) - local_9e0) * local_9f8 + local_a9c * local_9f0) *
                                   8) * (double)((local_aa8 + iVar5 * -4) *
                                                 (local_aa4 + in_stack_fffffffffffff4fc * -4) *
                                                (local_aa0 + iVar6 * -4)) +
                                 *(double *)
                                  (local_a08 +
                                  ((long)(iVar5 - local_9e8) +
                                   ((in_stack_fffffffffffff4fc + 1) - local_9e4) * local_a00 +
                                   ((iVar6 + 1) - local_9e0) * local_9f8 + local_a9c * local_9f0) *
                                  8) * (double)(((iVar5 + 1) * 4 - local_aa8) *
                                                (local_aa4 + in_stack_fffffffffffff4fc * -4) *
                                               (local_aa0 + iVar6 * -4)) +
                                 *(double *)
                                  (local_a08 +
                                  ((long)((iVar5 + 1) - local_9e8) +
                                   (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                                   ((iVar6 + 1) - local_9e0) * local_9f8 + local_a9c * local_9f0) *
                                  8) * (double)((local_aa8 + iVar5 * -4) *
                                                ((in_stack_fffffffffffff4fc + 1) * 4 - local_aa4) *
                                               (local_aa0 + iVar6 * -4)) +
                                 *(double *)
                                  (local_a08 +
                                  ((long)(iVar5 - local_9e8) +
                                   (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                                   ((iVar6 + 1) - local_9e0) * local_9f8 + local_a9c * local_9f0) *
                                  8) * (double)(((iVar5 + 1) * 4 - local_aa8) *
                                                ((in_stack_fffffffffffff4fc + 1) * 4 - local_aa4) *
                                               (local_aa0 + iVar6 * -4)) +
                                 *(double *)
                                  (local_a08 +
                                  ((long)((iVar5 + 1) - local_9e8) +
                                   ((in_stack_fffffffffffff4fc + 1) - local_9e4) * local_a00 +
                                   (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                                 (double)((local_aa8 + iVar5 * -4) *
                                          (local_aa4 + in_stack_fffffffffffff4fc * -4) *
                                         ((iVar6 + 1) * 4 - local_aa0)) +
                                 *(double *)
                                  (local_a08 +
                                  ((long)(iVar5 - local_9e8) +
                                   ((in_stack_fffffffffffff4fc + 1) - local_9e4) * local_a00 +
                                   (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                                 (double)(((iVar5 + 1) * 4 - local_aa8) *
                                          (local_aa4 + in_stack_fffffffffffff4fc * -4) *
                                         ((iVar6 + 1) * 4 - local_aa0)) +
                                 *(double *)
                                  (local_a08 +
                                  ((long)(iVar5 - local_9e8) +
                                   (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                                   (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                                 (double)(((iVar5 + 1) * 4 - local_aa8) *
                                          ((in_stack_fffffffffffff4fc + 1) * 4 - local_aa4) *
                                         ((iVar6 + 1) * 4 - local_aa0)) +
                                 *(double *)
                                  (local_a08 +
                                  ((long)((iVar5 + 1) - local_9e8) +
                                   (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                                   (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                                 (double)((local_aa8 + iVar5 * -4) *
                                          ((in_stack_fffffffffffff4fc + 1) * 4 - local_aa4) *
                                         ((iVar6 + 1) * 4 - local_aa0))) * 0.015625;
                          }
                          else {
                            *(double *)
                             (*local_980 +
                             ((long)(local_aa8 - (int)local_980[4]) +
                              (long)(local_aa4 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                              (long)(local_aa0 - (int)local_980[5]) * local_980[2] +
                             (long)local_a9c * local_980[3]) * 8) =
                                 (*(double *)
                                   (local_a08 +
                                   ((long)((iVar5 + 1) - local_9e8) +
                                    ((in_stack_fffffffffffff4fc + 1) - local_9e4) * local_a00 +
                                    (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                                  (double)((local_aa8 + iVar5 * -4) *
                                          (local_aa4 + in_stack_fffffffffffff4fc * -4)) +
                                 *(double *)
                                  (local_a08 +
                                  ((long)(iVar5 - local_9e8) +
                                   ((in_stack_fffffffffffff4fc + 1) - local_9e4) * local_a00 +
                                   (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                                 (double)(((iVar5 + 1) * 4 - local_aa8) *
                                         (local_aa4 + in_stack_fffffffffffff4fc * -4)) +
                                 *(double *)
                                  (local_a08 +
                                  ((long)(iVar5 - local_9e8) +
                                   (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                                   (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                                 (double)(((iVar5 + 1) * 4 - local_aa8) *
                                         ((in_stack_fffffffffffff4fc + 1) * 4 - local_aa4)) +
                                 *(double *)
                                  (local_a08 +
                                  ((long)((iVar5 + 1) - local_9e8) +
                                   (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                                   (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                                 (double)((local_aa8 + iVar5 * -4) *
                                         ((in_stack_fffffffffffff4fc + 1) * 4 - local_aa4))) *
                                 0.0625;
                          }
                        }
                        else {
                          *(double *)
                           (*local_980 +
                           ((long)(local_aa8 - (int)local_980[4]) +
                            (long)(local_aa4 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                            (long)(local_aa0 - (int)local_980[5]) * local_980[2] +
                           (long)local_a9c * local_980[3]) * 8) =
                               (*(double *)
                                 (local_a08 +
                                 ((long)((iVar5 + 1) - local_9e8) +
                                  (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                                  ((iVar6 + 1) - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8
                                 ) * (double)((local_aa8 + iVar5 * -4) * (local_aa0 + iVar6 * -4)) +
                               *(double *)
                                (local_a08 +
                                ((long)(iVar5 - local_9e8) +
                                 (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                                 ((iVar6 + 1) - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8)
                               * (double)(((iVar5 + 1) * 4 - local_aa8) * (local_aa0 + iVar6 * -4))
                               + *(double *)
                                  (local_a08 +
                                  ((long)(iVar5 - local_9e8) +
                                   (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                                   (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                                 (double)(((iVar5 + 1) * 4 - local_aa8) *
                                         ((iVar6 + 1) * 4 - local_aa0)) +
                                 *(double *)
                                  (local_a08 +
                                  ((long)((iVar5 + 1) - local_9e8) +
                                   (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                                   (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                                 (double)((local_aa8 + iVar5 * -4) * ((iVar6 + 1) * 4 - local_aa0)))
                               * 0.0625;
                        }
                      }
                      else {
                        *(double *)
                         (*local_980 +
                         ((long)(local_aa8 - (int)local_980[4]) +
                          (long)(local_aa4 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                          (long)(local_aa0 - (int)local_980[5]) * local_980[2] +
                         (long)local_a9c * local_980[3]) * 8) =
                             (*(double *)
                               (local_a08 +
                               ((long)(iVar5 - local_9e8) +
                                ((in_stack_fffffffffffff4fc + 1) - local_9e4) * local_a00 +
                                ((iVar6 + 1) - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8)
                              * (double)((local_aa4 + in_stack_fffffffffffff4fc * -4) *
                                        (local_aa0 + iVar6 * -4)) +
                             *(double *)
                              (local_a08 +
                              ((long)(iVar5 - local_9e8) +
                               (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                               ((iVar6 + 1) - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                             (double)(((in_stack_fffffffffffff4fc + 1) * 4 - local_aa4) *
                                     (local_aa0 + iVar6 * -4)) +
                             *(double *)
                              (local_a08 +
                              ((long)(iVar5 - local_9e8) +
                               (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                               (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                             (double)(((in_stack_fffffffffffff4fc + 1) * 4 - local_aa4) *
                                     ((iVar6 + 1) * 4 - local_aa0)) +
                             *(double *)
                              (local_a08 +
                              ((long)(iVar5 - local_9e8) +
                               ((in_stack_fffffffffffff4fc + 1) - local_9e4) * local_a00 +
                               (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                             (double)((local_aa4 + in_stack_fffffffffffff4fc * -4) *
                                     ((iVar6 + 1) * 4 - local_aa0))) * 0.0625;
                      }
                    }
                    else {
                      *(double *)
                       (*local_980 +
                       ((long)(local_aa8 - (int)local_980[4]) +
                        (long)(local_aa4 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                        (long)(local_aa0 - (int)local_980[5]) * local_980[2] +
                       (long)local_a9c * local_980[3]) * 8) =
                           (*(double *)
                             (local_a08 +
                             ((long)(iVar5 - local_9e8) +
                              (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                              (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                            (double)((iVar5 + 1) * 4 - local_aa8) +
                           *(double *)
                            (local_a08 +
                            ((long)((iVar5 + 1) - local_9e8) +
                             (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                             (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                           (double)(local_aa8 + iVar5 * -4)) * 0.25;
                    }
                  }
                  else {
                    *(double *)
                     (*local_980 +
                     ((long)(local_aa8 - (int)local_980[4]) +
                      (long)(local_aa4 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                      (long)(local_aa0 - (int)local_980[5]) * local_980[2] +
                     (long)local_a9c * local_980[3]) * 8) =
                         (*(double *)
                           (local_a08 +
                           ((long)(iVar5 - local_9e8) +
                            (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                            (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                          (double)((in_stack_fffffffffffff4fc + 1) * 4 - local_aa4) +
                         *(double *)
                          (local_a08 +
                          ((long)(iVar5 - local_9e8) +
                           ((in_stack_fffffffffffff4fc + 1) - local_9e4) * local_a00 +
                           (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                         (double)(local_aa4 + in_stack_fffffffffffff4fc * -4)) * 0.25;
                  }
                }
                else {
                  *(double *)
                   (*local_980 +
                   ((long)(local_aa8 - (int)local_980[4]) +
                    (long)(local_aa4 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                    (long)(local_aa0 - (int)local_980[5]) * local_980[2] +
                   (long)local_a9c * local_980[3]) * 8) =
                       (*(double *)
                         (local_a08 +
                         ((long)(iVar5 - local_9e8) +
                          (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                          (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                        (double)((iVar6 + 1) * 4 - local_aa0) +
                       *(double *)
                        (local_a08 +
                        ((long)(iVar5 - local_9e8) +
                         (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                         ((iVar6 + 1) - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8) *
                       (double)(local_aa0 + iVar6 * -4)) * 0.25;
                }
              }
              else {
                *(undefined8 *)
                 (*local_980 +
                 ((long)(local_aa8 - (int)local_980[4]) +
                  (long)(local_aa4 - *(int *)((long)local_980 + 0x24)) * local_980[1] +
                  (long)(local_aa0 - (int)local_980[5]) * local_980[2] +
                 (long)local_a9c * local_980[3]) * 8) =
                     *(undefined8 *)
                      (local_a08 +
                      ((long)(iVar5 - local_9e8) +
                       (in_stack_fffffffffffff4fc - local_9e4) * local_a00 +
                       (iVar6 - local_9e0) * local_9f8 + local_a9c * local_9f0) * 8);
              }
            }
          }
        }
      }
    }
    MFIter::operator++(&local_958);
  }
  MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0));
  return;
}

Assistant:

void
MLNodeLinOp::AnyInterpolationAmr (int famrlev, Any& a_fine, const Any& a_crse,
                                  IntVect const& nghost) const
{
    AMREX_ASSERT(a_fine.is<MultiFab>());
    MultiFab& fine = a_fine.get<MultiFab>();
    MultiFab const& crse = a_crse.get<MultiFab>();

    const int ncomp = getNComp();
    const int refratio = AMRRefRatio(famrlev-1);

    AMREX_ALWAYS_ASSERT(refratio == 2 || refratio == 4);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(fine, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        Box fbx = mfi.tilebox();
        fbx.grow(nghost);
        Array4<Real> const& ffab = fine.array(mfi);
        Array4<Real const> const& cfab = crse.const_array(mfi);

        if (refratio == 2) {
            AMREX_HOST_DEVICE_FOR_4D ( fbx, ncomp, i, j, k, n,
            {
                mlmg_lin_nd_interp_r2(i,j,k,n,ffab,cfab);
            });
        } else {
            AMREX_HOST_DEVICE_FOR_4D ( fbx, ncomp, i, j, k, n,
            {
                mlmg_lin_nd_interp_r4(i,j,k,n,ffab,cfab);
            });
        }
    }
}